

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer.c
# Opt level: O2

int WebRtc_MoveReadPtr(RingBuffer *self,int element_count)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  
  if (self == (RingBuffer *)0x0) {
    iVar5 = 0;
  }
  else {
    sVar3 = WebRtc_available_write(self);
    sVar4 = WebRtc_available_read(self);
    if ((int)sVar4 < element_count) {
      element_count = (int)sVar4;
    }
    iVar5 = -(int)sVar3;
    if (element_count != iVar5 && SBORROW4(element_count,iVar5) == element_count + (int)sVar3 < 0) {
      iVar5 = element_count;
    }
    iVar2 = (int)self->read_pos + iVar5;
    iVar1 = (int)self->element_count;
    if (iVar2 - iVar1 != 0 && iVar1 <= iVar2) {
      self->rw_wrap = SAME_WRAP;
      iVar2 = iVar2 - iVar1;
    }
    if (iVar2 < 0) {
      iVar2 = iVar2 + iVar1;
      self->rw_wrap = DIFF_WRAP;
    }
    self->read_pos = (long)iVar2;
  }
  return iVar5;
}

Assistant:

int WebRtc_MoveReadPtr(RingBuffer* self, int element_count) {
  if (!self) {
    return 0;
  }

  {
    // We need to be able to take care of negative changes, hence use "int"
    // instead of "size_t".
    const int free_elements = (int) WebRtc_available_write(self);
    const int readable_elements = (int) WebRtc_available_read(self);
    int read_pos = (int) self->read_pos;

    if (element_count > readable_elements) {
      element_count = readable_elements;
    }
    if (element_count < -free_elements) {
      element_count = -free_elements;
    }

    read_pos += element_count;
    if (read_pos > (int) self->element_count) {
      // Buffer wrap around. Restart read position and wrap indicator.
      read_pos -= (int) self->element_count;
      self->rw_wrap = SAME_WRAP;
    }
    if (read_pos < 0) {
      // Buffer wrap around. Restart read position and wrap indicator.
      read_pos += (int) self->element_count;
      self->rw_wrap = DIFF_WRAP;
    }

    self->read_pos = (size_t) read_pos;

    return element_count;
  }
}